

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O2

void Cec_ManPatCleanMark0(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  if (((int)(uint)*(undefined8 *)pObj < 0) &&
     (((uint)*(undefined8 *)pObj & 0x1fffffff) != 0x1fffffff)) {
    Gia_ManIncrementTravId(p);
    Cec_ManPatComputePattern4_rec(p,pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff));
    return;
  }
  __assert_fail("Gia_ObjIsCo(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecPat.c"
                ,0x157,"void Cec_ManPatCleanMark0(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Cec_ManPatCleanMark0( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    assert( Gia_ObjIsCo(pObj) );
    Gia_ManIncrementTravId( p );
    Cec_ManPatComputePattern4_rec( p, Gia_ObjFanin0(pObj) );
}